

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O3

void __thiscall RBTS<RemSP>::FirstScan(RBTS<RemSP> *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  Mat1i *pMVar4;
  Mat1b *pMVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int *piVar22;
  long lVar23;
  int *piVar24;
  size_t sVar25;
  size_t sVar26;
  int iVar27;
  int iVar28;
  size_t sVar29;
  int iVar30;
  size_t sVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uint i;
  long local_60;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  local_60 = 0;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar10 = (long)*(int *)&pMVar5->field_0x8;
  if (0 < lVar10) {
    iVar2 = *(int *)&pMVar5->field_0xc;
    auVar38 = _DAT_00328420;
    auVar39 = _DAT_00328430;
    auVar40 = _DAT_00328440;
    do {
      if (0 < iVar2) {
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar23 = **(long **)&pMVar5->field_0x48 * local_60 + *(long *)&pMVar5->field_0x10;
        lVar8 = *(long *)&pMVar4->field_0x10;
        lVar20 = **(long **)&pMVar4->field_0x48;
        lVar13 = lVar20 * local_60;
        lVar1 = lVar8 + lVar13;
        lVar20 = lVar1 - lVar20;
        iVar30 = iVar2 * (int)local_60;
        lVar8 = lVar8 + lVar13 + 0xc;
        iVar28 = 0;
        do {
          lVar13 = (long)iVar28;
          iVar18 = iVar28;
          if (*(char *)(lVar23 + lVar13) != '\0') {
            iVar16 = iVar28 + iVar30;
            piVar22 = (this->s_queue_).buffer_;
            sVar25 = (this->s_queue_).size_ + 1;
            (this->s_queue_).size_ = sVar25;
            sVar6 = (this->s_queue_).tail_;
            piVar22[sVar6] = iVar16;
            sVar26 = (this->s_queue_).capacity_;
            iVar18 = iVar28 + 1;
            if (iVar28 + 1 < iVar2) {
              iVar18 = iVar2;
            }
            (this->s_queue_).tail_ = (sVar6 + 1) % sVar26;
            iVar27 = iVar28;
            do {
              lVar13 = lVar13 + 1;
              iVar11 = iVar18;
              if (iVar2 <= lVar13) break;
              iVar11 = iVar27 + 1;
              iVar27 = iVar11;
            } while (*(char *)(lVar23 + lVar13) != '\0');
            iVar18 = iVar11 + -1;
            iVar9 = iVar18 + iVar30;
            piVar24 = (this->e_queue_).buffer_;
            sVar31 = (this->e_queue_).size_ + 1;
            (this->e_queue_).size_ = sVar31;
            sVar6 = (this->e_queue_).tail_;
            piVar24[sVar6] = iVar9;
            uVar14 = (this->s_queue_).head_;
            sVar29 = (this->e_queue_).capacity_;
            (this->e_queue_).tail_ = (sVar6 + 1) % sVar29;
            uVar15 = (this->e_queue_).head_;
            iVar17 = (iVar16 - iVar2) - (uint)(iVar28 != 0);
            iVar27 = piVar24[uVar15];
            if (iVar27 < iVar17) {
              do {
                sVar25 = sVar25 - 1;
                uVar14 = (uVar14 + 1) % sVar26;
                sVar31 = sVar31 - 1;
                uVar15 = (uVar15 + 1) % sVar29;
                iVar27 = piVar24[uVar15];
              } while (iVar27 < iVar17);
              iVar17 = piVar22[uVar14];
              (this->s_queue_).size_ = sVar25;
              (this->s_queue_).head_ = uVar14;
              (this->e_queue_).size_ = sVar31;
              (this->e_queue_).head_ = uVar15;
            }
            else {
              iVar17 = piVar22[uVar14];
            }
            uVar3 = RemSP::length_;
            iVar9 = iVar9 - iVar2;
            iVar11 = (uint)(iVar11 != iVar2) + iVar9;
            if (iVar11 < iVar17) {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              uVar12 = (uint)((long)iVar16 % (long)iVar2);
              uVar7 = (iVar18 - iVar28) + uVar12 + 1;
              if (uVar12 < uVar7) {
                uVar14 = (long)iVar16 % (long)iVar2 & 0xffffffff;
                lVar19 = uVar7 - uVar14;
                lVar13 = lVar19 + -1;
                auVar34._8_4_ = (int)lVar13;
                auVar34._0_8_ = lVar13;
                auVar34._12_4_ = (int)((ulong)lVar13 >> 0x20);
                lVar13 = lVar8 + uVar14 * 4;
                auVar34 = auVar34 ^ auVar40;
                uVar14 = 0;
                do {
                  auVar37._8_4_ = (int)uVar14;
                  auVar37._0_8_ = uVar14;
                  auVar37._12_4_ = (int)(uVar14 >> 0x20);
                  auVar36 = (auVar37 | auVar39) ^ auVar40;
                  iVar28 = auVar34._4_4_;
                  if ((bool)(~(iVar28 < auVar36._4_4_ ||
                              auVar34._0_4_ < auVar36._0_4_ && auVar36._4_4_ == iVar28) & 1)) {
                    *(uint *)(lVar13 + -0xc + uVar14 * 4) = uVar3;
                  }
                  if (auVar36._12_4_ <= auVar34._12_4_ &&
                      (auVar36._8_4_ <= auVar34._8_4_ || auVar36._12_4_ != auVar34._12_4_)) {
                    *(uint *)(lVar13 + -8 + uVar14 * 4) = uVar3;
                  }
                  auVar36 = (auVar37 | auVar38) ^ auVar40;
                  iVar16 = auVar36._4_4_;
                  if (iVar16 <= iVar28 && (iVar16 != iVar28 || auVar36._0_4_ <= auVar34._0_4_)) {
                    *(uint *)(lVar13 + -4 + uVar14 * 4) = uVar3;
                    *(uint *)(lVar13 + uVar14 * 4) = uVar3;
                  }
                  uVar14 = uVar14 + 4;
                } while ((lVar19 + 3U & 0xfffffffffffffffc) != uVar14);
              }
            }
            else {
              uVar3 = *(uint *)(lVar20 + (long)(iVar17 % iVar2) * 4);
              uVar21 = (long)iVar16 % (long)iVar2 & 0xffffffff;
              uVar12 = (uint)((long)iVar16 % (long)iVar2);
              uVar7 = (iVar18 - iVar28) + uVar12 + 1;
              if (uVar12 < uVar7) {
                lVar19 = uVar7 - uVar21;
                lVar13 = lVar19 + -1;
                auVar36._8_4_ = (int)lVar13;
                auVar36._0_8_ = lVar13;
                auVar36._12_4_ = (int)((ulong)lVar13 >> 0x20);
                lVar13 = lVar8 + uVar21 * 4;
                uVar21 = 0;
                do {
                  auVar35._8_4_ = (int)uVar21;
                  auVar35._0_8_ = uVar21;
                  auVar35._12_4_ = (int)(uVar21 >> 0x20);
                  auVar34 = auVar36 ^ auVar40;
                  auVar37 = (auVar35 | auVar39) ^ auVar40;
                  iVar28 = auVar34._4_4_;
                  if ((bool)(~(iVar28 < auVar37._4_4_ ||
                              auVar34._0_4_ < auVar37._0_4_ && auVar37._4_4_ == iVar28) & 1)) {
                    *(uint *)(lVar13 + -0xc + uVar21 * 4) = uVar3;
                  }
                  if (auVar37._12_4_ <= auVar34._12_4_ &&
                      (auVar37._8_4_ <= auVar34._8_4_ || auVar37._12_4_ != auVar34._12_4_)) {
                    *(uint *)(lVar13 + -8 + uVar21 * 4) = uVar3;
                  }
                  auVar35 = (auVar35 | auVar38) ^ auVar40;
                  iVar16 = auVar35._4_4_;
                  if (iVar16 <= iVar28 && (iVar16 != iVar28 || auVar35._0_4_ <= auVar34._0_4_)) {
                    *(uint *)(lVar13 + -4 + uVar21 * 4) = uVar3;
                    *(uint *)(lVar13 + uVar21 * 4) = uVar3;
                  }
                  uVar21 = uVar21 + 4;
                } while ((lVar19 + 3U & 0xfffffffffffffffc) != uVar21);
              }
              iVar28 = iVar27;
              if (iVar27 <= iVar9) {
                bVar32 = false;
                do {
                  if (bVar32) {
                    RemSP::Merge(*(uint *)(lVar20 + (long)(iVar17 % iVar2) * 4),uVar3);
                    sVar25 = (this->s_queue_).size_;
                    piVar22 = (this->s_queue_).buffer_;
                    sVar26 = (this->s_queue_).capacity_;
                    uVar14 = (this->s_queue_).head_;
                    sVar31 = (this->e_queue_).size_;
                    piVar24 = (this->e_queue_).buffer_;
                    uVar15 = (this->e_queue_).head_;
                    sVar29 = (this->e_queue_).capacity_;
                    auVar38 = _DAT_00328420;
                    auVar39 = _DAT_00328430;
                    auVar40 = _DAT_00328440;
                  }
                  sVar25 = sVar25 - 1;
                  (this->s_queue_).size_ = sVar25;
                  uVar14 = (uVar14 + 1) % sVar26;
                  (this->s_queue_).head_ = uVar14;
                  iVar17 = piVar22[uVar14];
                  sVar31 = sVar31 - 1;
                  (this->e_queue_).size_ = sVar31;
                  uVar15 = (uVar15 + 1) % sVar29;
                  (this->e_queue_).head_ = uVar15;
                  bVar32 = true;
                  iVar28 = piVar24[uVar15];
                } while (piVar24[uVar15] <= iVar9);
              }
              if (iVar9 < iVar28) {
                if (iVar11 < iVar17) goto LAB_001ba78c;
                bVar33 = SBORROW4(iVar27,iVar9);
                iVar28 = iVar27 - iVar9;
                bVar32 = iVar27 == iVar9;
              }
              else {
                do {
                  sVar25 = sVar25 - 1;
                  uVar14 = (uVar14 + 1) % sVar26;
                  sVar31 = sVar31 - 1;
                  uVar15 = (uVar15 + 1) % sVar29;
                } while (piVar24[uVar15] <= iVar9);
                (this->s_queue_).size_ = sVar25;
                (this->s_queue_).head_ = uVar14;
                (this->e_queue_).size_ = sVar31;
                (this->e_queue_).head_ = uVar15;
                iVar17 = piVar22[uVar14];
                bVar33 = SBORROW4(iVar17,iVar11);
                iVar28 = iVar17 - iVar11;
                bVar32 = iVar17 == iVar11;
              }
              if (bVar32 || bVar33 != iVar28 < 0) {
                RemSP::Merge(*(uint *)(lVar1 + (long)(int)uVar12 * 4),
                             *(uint *)(lVar20 + (long)(iVar17 % iVar2) * 4));
                auVar38 = _DAT_00328420;
                auVar39 = _DAT_00328430;
                auVar40 = _DAT_00328440;
              }
            }
          }
LAB_001ba78c:
          iVar28 = iVar18 + 1;
        } while (iVar28 < iVar2);
      }
      local_60 = local_60 + 1;
    } while (local_60 != lVar10);
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue_.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue_.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue_.Front();
                int t = e_queue_.Front();
                while (t < s - w - clb) {
                    h = s_queue_.DequeueAndFront();
                    t = e_queue_.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue_.DequeueAndFront();
                        t = e_queue_.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue_.Dequeue();
                        e_queue_.Dequeue();
                        h = s_queue_.Front();
                        t = e_queue_.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for
        
    }